

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O0

bool __thiscall HtmlModelSerialiser::saveModel(HtmlModelSerialiser *this,QString *destination)

{
  QXmlStreamWriter local_30 [8];
  QXmlStreamWriter writer;
  HtmlModelSerialiserPrivate *d;
  QString *destination_local;
  HtmlModelSerialiser *this_local;
  
  if (destination == (QString *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    _writer = d_func(this);
    if ((_writer->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
        m_constModel == (QAbstractItemModel *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      QXmlStreamWriter::QXmlStreamWriter(local_30,(QString *)destination);
      this_local._7_1_ = HtmlModelSerialiserPrivate::writeHtml(_writer,local_30);
      QXmlStreamWriter::~QXmlStreamWriter(local_30);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HtmlModelSerialiser::saveModel(QString *destination) const
{
    if (!destination)
        return false;
    Q_D(const HtmlModelSerialiser);

    if (!d->m_constModel)
        return false;
    QXmlStreamWriter writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeHtml(writer);
}